

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveOnSurface.h
# Opt level: O0

vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> * __thiscall
anurbs::
CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
::spans(vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *__return_storage_ptr__,
       CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
       *this)

{
  Interval domain;
  element_type *peVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  Interval local_130;
  double local_120;
  double t1;
  double t0;
  Index i;
  size_type local_100;
  Index nb_spans;
  VectorXd local_e8;
  undefined1 local_d8 [8];
  vector<double,_std::allocator<double>_> intersection;
  undefined1 local_b0 [8];
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> knots_v;
  undefined1 local_88 [8];
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> knots_u;
  undefined1 local_50 [24];
  Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_> curve;
  CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
  *this_local;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *result;
  
  curve.m_domain.m_t1 = (double)this;
  curve_geometry((CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
                  *)local_50);
  (*(this->super_CurveBase<3L>)._vptr_CurveBase[3])();
  domain.m_t1 = in_XMM1_Qa;
  domain.m_t0 = extraout_XMM0_Qa;
  Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_>::Curve
            ((Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_> *)(local_50 + 0x10),
             (shared_ptr<anurbs::NurbsCurveGeometry<2L>_> *)local_50,domain);
  std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>::~shared_ptr
            ((shared_ptr<anurbs::NurbsCurveGeometry<2L>_> *)local_50);
  surface_geometry((CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
                    *)&knots_v.
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                       .field_0x10);
  peVar1 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&knots_v.
                            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                            .field_0x10);
  NurbsSurfaceGeometry<3L>::knots_u
            ((Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)local_88,
             peVar1);
  std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>::~shared_ptr
            ((shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_> *)
             &knots_v.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              .field_0x10);
  surface_geometry((CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
                    *)&intersection.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  peVar1 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&intersection.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage);
  NurbsSurfaceGeometry<3L>::knots_v
            ((Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)local_b0,
             peVar1);
  std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>::~shared_ptr
            ((shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_> *)
             &intersection.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_e8,
             (EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)local_88);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((Matrix<double,_1,1,0,_1,1> *)&nb_spans,
             (EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)local_b0);
  CurveSpanIntersection::compute
            ((vector<double,_std::allocator<double>_> *)local_d8,(CurveBase<2L> *)(local_50 + 0x10),
             &local_e8,(VectorXd *)&nb_spans,0.0001,true);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&nb_spans);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_e8);
  sVar2 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_d8);
  i._7_1_ = 0;
  local_100 = sVar2 - 1;
  std::allocator<anurbs::Interval>::allocator((allocator<anurbs::Interval> *)((long)&i + 6));
  std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::vector
            (__return_storage_ptr__,sVar2 - 1,(allocator<anurbs::Interval> *)((long)&i + 6));
  std::allocator<anurbs::Interval>::~allocator((allocator<anurbs::Interval> *)((long)&i + 6));
  for (t0 = 0.0; (long)t0 < (long)local_100; t0 = (double)((long)t0 + 1)) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_d8,(size_type)t0);
    t1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_d8,(long)t0 + 1);
    local_120 = *pvVar3;
    Interval::Interval(&local_130,t1,local_120);
    pvVar4 = std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::operator[]
                       (__return_storage_ptr__,(size_type)t0);
    pvVar4->m_t0 = local_130.m_t0;
    pvVar4->m_t1 = local_130.m_t1;
  }
  i._7_1_ = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_d8);
  Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_>::~Curve
            ((Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_> *)(local_50 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

std::vector<Interval> spans() const override
    {
        Curve<2, TCurveRef> curve(curve_geometry(), domain());

        const auto knots_u = surface_geometry()->knots_u();
        const auto knots_v = surface_geometry()->knots_v();

        const auto intersection =
            CurveSpanIntersection::compute(curve, knots_u, knots_v, 1e-4, true);

        const Index nb_spans = static_cast<Index>(intersection.size() - 1);

        std::vector<Interval> result(nb_spans);

        for (Index i = 0; i < nb_spans; i++) {
            double t0 = intersection[i];
            double t1 = intersection[i + 1];

            result[i] = Interval(t0, t1);
        }

        return result;
    }